

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O1

int Dsc_CountAnds_rec(char *pStr,char **p,int *pMatches)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  pcVar3 = *p;
  cVar5 = *pcVar3;
  if ((byte)(cVar5 + 0xbfU) < 6 || (byte)(cVar5 - 0x30U) < 10) {
    do {
      pcVar3 = pcVar3 + 1;
      *p = pcVar3;
      cVar5 = *pcVar3;
    } while ((byte)(cVar5 - 0x30U) < 10 || (byte)(cVar5 + 0xbfU) < 6);
  }
  if ((cVar5 == '<') && (pStr[(long)pMatches[(long)pcVar3 - (long)pStr] + 1] == '{')) {
    *p = pStr + (long)pMatches[(long)pcVar3 - (long)pStr] + 1;
  }
  pbVar4 = (byte *)*p;
  bVar1 = *pbVar4;
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    return 0;
  }
  if (bVar1 < 0x5b) {
    if (bVar1 == 0x28) {
LAB_0051f2f3:
      if ((int)(char)bVar1 + (uint)(bVar1 != 0x28) + 1 !=
          (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,0x1ea,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
      iVar7 = (uint)(bVar1 != 0x28) * 2 + 1;
      pbVar8 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
      pbVar4 = pbVar4 + 1;
      *p = (char *)pbVar4;
      iVar6 = 0;
      if (pbVar4 < pbVar8) {
        iVar6 = 0;
        do {
          iVar2 = Dsc_CountAnds_rec(pStr,p,pMatches);
          iVar6 = iVar6 + iVar7 + iVar2;
          pbVar4 = (byte *)(*p + 1);
          *p = (char *)pbVar4;
        } while (pbVar4 < pbVar8);
      }
      if (pbVar4 == pbVar8) {
        return iVar6 - iVar7;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                    ,0x1ed,"int Dsc_CountAnds_rec(char *, char **, int *)");
    }
    if (bVar1 != 0x3c) {
LAB_0051f44e:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                    ,0x1fa,"int Dsc_CountAnds_rec(char *, char **, int *)");
    }
  }
  else if (bVar1 != 0x7b) {
    if (bVar1 != 0x5b) goto LAB_0051f44e;
    goto LAB_0051f2f3;
  }
  iVar6 = pMatches[(long)pbVar4 - (long)pStr];
  if ((int)(char)bVar1 + (uint)(bVar1 != 0x28) + 1 != (int)pStr[iVar6]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                  ,500,"int Dsc_CountAnds_rec(char *, char **, int *)");
  }
  pbVar4 = pbVar4 + 1;
  *p = (char *)pbVar4;
  iVar7 = 3;
  while (pbVar4 < pStr + iVar6) {
    iVar2 = Dsc_CountAnds_rec(pStr,p,pMatches);
    iVar7 = iVar7 + iVar2;
    pbVar4 = (byte *)(*p + 1);
    *p = (char *)pbVar4;
  }
  if (pbVar4 == (byte *)(pStr + iVar6)) {
    return iVar7;
  }
  __assert_fail("*p == q",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                ,0x1f7,"int Dsc_CountAnds_rec(char *, char **, int *)");
}

Assistant:

int Dsc_CountAnds_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return 0;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        int Counter = 0, AddOn = (**p == '(')? 1 : 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += AddOn + Dsc_CountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter - AddOn;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int Counter = 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += Dsc_CountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter;
    }
    assert( 0 );
    return 0;
}